

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_list.cpp
# Opt level: O1

int __thiscall sc_core::sc_plist_base::remove(sc_plist_base *this,char *__filename)

{
  undefined8 uVar1;
  long lVar2;
  void *pvVar3;
  
  if (this->head == (handle_t)__filename) {
    pvVar3 = pop_front(this);
    return (int)pvVar3;
  }
  if (this->tail != (handle_t)__filename) {
    uVar1 = *(undefined8 *)__filename;
    lVar2 = *(long *)(__filename + 8);
    *(undefined8 *)(lVar2 + 0x10) = *(undefined8 *)(__filename + 0x10);
    *(long *)(*(long *)(__filename + 0x10) + 8) = lVar2;
    sc_mempool::release(__filename,0x18);
    return (int)uVar1;
  }
  pvVar3 = pop_back(this);
  return (int)pvVar3;
}

Assistant:

void*
sc_plist_base::remove( handle_t h )
{
    if (h == head)
        return pop_front();
    else if (h == tail)
        return pop_back();
    else {
        void* d = h->data;
        h->prev->next = h->next;
        h->next->prev = h->prev;
        delete h;
        return d;
    }
}